

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O2

int splittingStep_PrintAllStats(ARKodeMem ark_mem,FILE *outfile,SUNOutputFormat fmt)

{
  long lVar1;
  ARKodeSplittingStepMem pAVar2;
  int iVar3;
  long lVar4;
  ARKodeSplittingStepMem step_mem;
  char name_buf [29];
  
  step_mem = (ARKodeSplittingStepMem)0x0;
  iVar3 = splittingStep_AccessStepMem(ark_mem,"splittingStep_PrintAllStats",&step_mem);
  pAVar2 = step_mem;
  if (iVar3 == 0) {
    for (lVar4 = 0; lVar4 < pAVar2->partitions; lVar4 = lVar4 + 1) {
      snprintf(name_buf,0x1d,"Partition %i evolves",(ulong)((int)lVar4 + 1));
      lVar1 = pAVar2->n_stepper_evolves[lVar4];
      if (fmt == SUN_OUTPUTFORMAT_TABLE) {
        fprintf((FILE *)outfile,"%-*s = %ld\n",0x1d,name_buf,lVar1);
      }
      else {
        fputc(0x2c,(FILE *)outfile);
        fprintf((FILE *)outfile,"%s,%ld",name_buf,lVar1);
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int splittingStep_PrintAllStats(ARKodeMem ark_mem, FILE* outfile,
                                       SUNOutputFormat fmt)
{
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  char name_buf[SUN_TABLE_WIDTH];
  for (int k = 0; k < step_mem->partitions; k++)
  {
    snprintf(name_buf, sizeof(name_buf), "Partition %i evolves", k + 1);
    sunfprintf_long(outfile, fmt, SUNFALSE, name_buf,
                    step_mem->n_stepper_evolves[k]);
  }

  return ARK_SUCCESS;
}